

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O3

void __thiscall FGameConfigFile::AddAutoexec(FGameConfigFile *this,DArgs *list,char *game)

{
  bool bVar1;
  int iVar2;
  char *value;
  FString expanded_path;
  char *key;
  char section [64];
  char *local_a0;
  FString local_98;
  char *local_90;
  DArgs *local_88;
  FString local_80;
  char local_78 [72];
  
  local_88 = list;
  mysnprintf(local_78,0x40,"%s.AutoExec",game);
  CreateStandardAutoExec(this,local_78,false);
  bVar1 = FConfigFile::SectionIsEmpty(&this->super_FConfigFile);
  if (!bVar1) {
    bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&local_90,&local_a0);
    if (bVar1) {
      do {
        iVar2 = strcasecmp(local_90,"Path");
        if ((iVar2 == 0) && (*local_a0 != '\0')) {
          ExpandEnvVars((char *)&local_98);
          bVar1 = FileExists(local_98.Chars);
          if (bVar1) {
            ExpandEnvVars((char *)&local_80);
            DArgs::AppendArg(local_88,&local_80);
            FString::~FString(&local_80);
          }
          FString::~FString(&local_98);
        }
        bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&local_90,&local_a0);
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void FGameConfigFile::AddAutoexec (DArgs *list, const char *game)
{
	char section[64];
	const char *key;
	const char *value;

	mysnprintf (section, countof(section), "%s.AutoExec", game);

	// If <game>.AutoExec section does not exist, create it
	// with a default autoexec.cfg file present.
	CreateStandardAutoExec(section, false);
	// Run any files listed in the <game>.AutoExec section
	if (!SectionIsEmpty())
	{
		while (NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0 && *value != '\0')
			{
				FString expanded_path = ExpandEnvVars(value);
				if (FileExists(expanded_path))
				{
					list->AppendArg (ExpandEnvVars(value));
				}
			}
		}
	}
}